

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_if.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseIf(Parser *this,bool isensure)

{
  Token *pTVar1;
  pointer pcVar2;
  Lexer *lexer;
  istream *piVar3;
  bool bVar4;
  IfExpr *this_00;
  bool in_DL;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var5;
  pointer *__ptr;
  undefined7 in_register_00000031;
  Parser *this_01;
  pointer __p;
  bool bVar6;
  IfCase ifcase;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> elseBody;
  vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  cases;
  IfCase startifcase;
  undefined1 local_a8 [32];
  vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  local_88;
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  local_68;
  Position local_58;
  
  this_01 = (Parser *)CONCAT71(in_register_00000031,isensure);
  pTVar1 = this_01->lexer->currentToken;
  local_58.line = (pTVar1->pos).line;
  local_58.startIndex = (pTVar1->pos).startIndex;
  local_58.endIndex = (pTVar1->pos).endIndex;
  local_88.
  super__Vector_base<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._24_8_ = this;
  parseIfStart((Parser *)&local_68,isensure);
  bVar6 = local_68.
          super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
          .
          super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
          ._M_head_impl._M_t.
          super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
          super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
          (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)0x0;
  if (local_68.
      super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      .
      super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      .
      super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
      ._M_head_impl._M_t.
      super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl !=
      (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0 && bVar6) {
    std::
    vector<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>
    ::
    emplace_back<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>
              ((vector<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>
                *)&local_88,&local_68);
  }
  local_a8._16_8_ = (Lexer *)0x0;
  bVar4 = expect(this_01,TOK_KW_ELSE);
  if (bVar4) {
    do {
      bVar4 = Token::operator==(this_01->lexer->currentToken,TOK_EOL);
      if (bVar4) {
        Lexer::next(this_01->lexer);
        parseFunctionBody((Parser *)local_a8);
        local_a8._16_8_ = local_a8._0_8_;
        local_a8._0_8_ = (BodyExpr *)0x0;
        std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                   local_a8);
        break;
      }
      parseIfStart((Parser *)local_a8,isensure);
      if (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
           local_a8._8_8_ != (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)0x0) &&
         (((__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)
           local_a8._0_8_ ==
           (__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0 ||
          (std::
           vector<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>
           ::
           emplace_back<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>
                     ((vector<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>
                       *)&local_88,
                      (tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                       *)local_a8),
          (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
          local_a8._8_8_ != (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)0x0)))) {
        (**(code **)((long)*(__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                             *)local_a8._8_8_ + 8))();
      }
      local_a8._8_8_ =
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)0x0;
      std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_a8)
      ;
      bVar4 = expect(this_01,TOK_KW_ELSE);
    } while (bVar4);
  }
  bVar4 = expect(this_01,TOK_STMT);
  if (!bVar4) {
    pTVar1 = this_01->lexer->currentToken;
    local_a8._0_8_ = operator_new(0x38);
    pcVar2 = (pointer)(pTVar1->pos).endIndex;
    *(undefined2 *)local_a8._0_8_ = 2;
    *(SyntaxErrorCode *)(local_a8._0_8_ + 4) = STX_ERR_EXPECTED_STMT;
    piVar3 = (istream *)(pTVar1->pos).startIndex;
    ((Position *)(local_a8._0_8_ + 8))->line = (pTVar1->pos).line;
    *(istream **)(local_a8._0_8_ + 0x10) = piVar3;
    (((string *)(local_a8._0_8_ + 0x18))->_M_dataplus)._M_p = pcVar2;
    (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(local_a8._0_8_ + 0x20))->
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(local_a8._0_8_ + 0x28))->_M_allocated_capacity = 0;
    *(pointer *)(local_a8._0_8_ + 0x30) = (pointer)0x0;
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_01);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    if ((__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>)
        local_a8._0_8_ != (tuple<pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)0x0)
    {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_a8,
                 (Error<pfederc::SyntaxErrorCode> *)local_a8._0_8_);
    }
  }
  if (local_68.
      super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      .
      super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      .
      super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
      ._M_head_impl._M_t.
      super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl !=
      (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0 && bVar6) {
    lexer = this_01->lexer;
    this_00 = (IfExpr *)operator_new(0x60);
    IfExpr::IfExpr(this_00,lexer,&local_58,&local_88,
                   (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                   (local_a8 + 0x10),in_DL);
    _Var5._M_head_impl = (Expr *)local_a8._24_8_;
    local_a8._0_8_ =
         (__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0;
    *(IfExpr **)local_a8._24_8_ = this_00;
    std::unique_ptr<pfederc::IfExpr,_std::default_delete<pfederc::IfExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::IfExpr,_std::default_delete<pfederc::IfExpr>_> *)local_a8);
  }
  else {
    *(_func_int ***)local_a8._24_8_ = (_func_int **)0x0;
    _Var5._M_head_impl = (Expr *)local_a8._24_8_;
  }
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
             (local_a8 + 0x10));
  if (local_68.
      super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      .
      super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
      ._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
      _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
      (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)0x0) {
    (**(code **)((long)*(__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                         *)local_68.
                           super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                           .
                           super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
                           ._M_head_impl._M_t.
                           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                           .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
  }
  local_68.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
  ._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)0x0;
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)&local_68);
  std::
  vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ::~vector(&local_88);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)_Var5._M_head_impl;
}

Assistant:

std::unique_ptr<Expr> Parser::parseIf(bool isensure) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  bool err = false;

  std::vector<IfCase> cases;
  IfCase startifcase = parseIfStart(isensure);
  if (std::get<0>(startifcase) && std::get<1>(startifcase))
    cases.push_back(std::move(startifcase));
  else
    err = true;

  std::unique_ptr<BodyExpr> elseBody;
  while (expect(TokenType::TOK_KW_ELSE)) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next(); // eat eol
      elseBody = parseFunctionBody();
      break;
    }

    IfCase ifcase = parseIfStart(isensure);
    if (std::get<0>(ifcase) && std::get<1>(ifcase))
      cases.push_back(std::move(ifcase));
  }

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
  }

  if (err)
    return nullptr;

  return std::make_unique<IfExpr>(lexer, pos,
    std::move(cases), std::move(elseBody), isensure);
}